

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpTests::init(ShaderAtomicOpTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *pTVar2;
  ShaderAtomicOpTests *pSVar3;
  bool bVar4;
  deUint32 dVar5;
  int extraout_EAX;
  long *plVar6;
  char *pcVar7;
  ShaderAtomicOpCase *pSVar8;
  TestNode *pTVar9;
  long *plVar10;
  size_type *psVar11;
  DataType DVar12;
  bool bVar13;
  Precision PVar14;
  allocator<char> local_b1;
  string caseName;
  undefined1 local_90 [8];
  long local_88;
  long local_80;
  long lStack_78;
  TestNode *local_70;
  AtomicOperandType local_64;
  Context *local_60;
  long *local_58 [2];
  long local_48 [2];
  ShaderAtomicOpTests *local_38;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  local_64 = this->m_operandType;
  local_38 = this;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
    caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"add",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar8 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar8,local_60,caseName._M_dataplus._M_p,"atomicAdd",local_64,DVar12,PVar14,
                 (UVec3 *)local_90);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_02162b20;
      pSVar8->m_initialValue = 1;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"min",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar8 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar8,local_60,caseName._M_dataplus._M_p,"atomicMin",local_64,DVar12,PVar14,
                 (UVec3 *)local_90);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_02162b80;
      dVar5 = 1000;
      if (pSVar8->m_precision == PRECISION_LOWP) {
        dVar5 = 100;
      }
      pSVar8->m_initialValue = dVar5;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"max",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar8 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar8,local_60,caseName._M_dataplus._M_p,"atomicMax",local_64,DVar12,PVar14,
                 (UVec3 *)local_90);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_02162be0;
      dVar5 = 0xfffffc18;
      if (pSVar8->m_precision == PRECISION_LOWP) {
        dVar5 = 0xffffff9c;
      }
      if (pSVar8->m_type != TYPE_INT) {
        dVar5 = 0;
      }
      pSVar8->m_initialValue = dVar5;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_60 = (Context *)CONCAT44(local_60._4_4_,pSVar3->m_operandType);
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  plVar6 = (long *)std::__cxx11::string::append(local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"and",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append(local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pTVar9 = (TestNode *)operator_new(200);
      ShaderAtomicAndCase::ShaderAtomicAndCase
                ((ShaderAtomicAndCase *)pTVar9,pCVar1,caseName._M_dataplus._M_p,
                 (AtomicOperandType)local_60,DVar12,PVar14);
      tcu::TestNode::addChild(local_70,pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_70,pTVar2,"or",caseName._M_dataplus._M_p)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar8 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar8,local_60,caseName._M_dataplus._M_p,"atomicOr",local_64,DVar12,PVar14,
                 (UVec3 *)local_90);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_02162ca0;
      pSVar8->m_initialValue = 1;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"xor",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar8 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar8,local_60,caseName._M_dataplus._M_p,"atomicXor",local_64,DVar12,PVar14,
                 (UVec3 *)local_90);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_02162d00;
      pSVar8->m_initialValue = 0;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_64 = pSVar3->m_operandType;
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_90 = (undefined1  [8])&local_80;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_60 = pCVar1;
  plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"exchange",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pSVar8 = (ShaderAtomicOpCase *)operator_new(200);
      local_90 = (undefined1  [8])0x200000003;
      local_88 = CONCAT44(local_88._4_4_,1);
      ShaderAtomicOpCase::ShaderAtomicOpCase
                (pSVar8,local_60,caseName._M_dataplus._M_p,"atomicExchange",local_64,DVar12,PVar14,
                 (UVec3 *)local_90);
      (pSVar8->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ShaderAtomicOpCase_02162d60;
      pSVar8->m_initialValue = 0;
      tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      pSVar3 = local_38;
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  pCVar1 = (pSVar3->super_TestCaseGroup).m_context;
  local_60 = (Context *)CONCAT44(local_60._4_4_,pSVar3->m_operandType);
  local_70 = (TestNode *)operator_new(0x70);
  pTVar2 = pCVar1->m_testCtx;
  local_88 = 7;
  local_80 = 0x2063696d6f7441;
  local_90 = (undefined1  [8])&local_80;
  plVar6 = (long *)std::__cxx11::string::append(local_90);
  caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName.field_2._8_8_ = plVar6[3];
  }
  else {
    caseName.field_2._M_allocated_capacity = *psVar11;
    caseName._M_dataplus._M_p = (pointer)*plVar6;
  }
  caseName._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,pTVar2,"compswap",caseName._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)caseName._M_dataplus._M_p != &caseName.field_2) {
    operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != (undefined1  [8])&local_80) {
    operator_delete((void *)local_90,local_80 + 1);
  }
  PVar14 = PRECISION_LOWP;
  do {
    DVar12 = TYPE_UINT;
    bVar4 = true;
    do {
      bVar13 = bVar4;
      pcVar7 = glu::getPrecisionName(PVar14);
      std::__cxx11::string::string<std::allocator<char>>((string *)local_58,pcVar7,&local_b1);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_90 = (undefined1  [8])&local_80;
      plVar10 = plVar6 + 2;
      if ((long *)*plVar6 == plVar10) {
        local_80 = *plVar10;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *plVar10;
        local_90 = (undefined1  [8])*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)plVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      glu::getDataTypeName(DVar12);
      plVar6 = (long *)std::__cxx11::string::append(local_90);
      caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName.field_2._8_8_ = plVar6[3];
      }
      else {
        caseName.field_2._M_allocated_capacity = *psVar11;
        caseName._M_dataplus._M_p = (pointer)*plVar6;
      }
      caseName._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_90 != (undefined1  [8])&local_80) {
        operator_delete((void *)local_90,local_80 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pTVar9 = (TestNode *)operator_new(0xa8);
      tcu::TestCase::TestCase
                ((TestCase *)pTVar9,pCVar1->m_testCtx,caseName._M_dataplus._M_p,
                 "atomicCompSwap() Test");
      pTVar9[1]._vptr_TestNode = (_func_int **)pCVar1;
      pTVar9->_vptr_TestNode = (_func_int **)&PTR__ShaderAtomicCompSwapCase_02162a68;
      *(AtomicOperandType *)&pTVar9[1].m_testCtx = (AtomicOperandType)local_60;
      *(DataType *)((long)&pTVar9[1].m_testCtx + 4) = DVar12;
      *(Precision *)&pTVar9[1].m_name._M_dataplus._M_p = PVar14;
      *(undefined8 *)((long)&pTVar9[1].m_name._M_dataplus._M_p + 4) = 0x200000003;
      *(undefined8 *)((long)&pTVar9[1].m_name._M_string_length + 4) = 0x400000001;
      *(undefined8 *)((long)&pTVar9[1].m_name.field_2 + 4) = 0x400000004;
      pTVar9[1].m_description._M_dataplus._M_p = (pointer)0x0;
      tcu::TestNode::addChild(local_70,pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)caseName._M_dataplus._M_p != &caseName.field_2) {
        operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
      }
      DVar12 = TYPE_INT;
      bVar4 = false;
    } while (bVar13);
    PVar14 = PVar14 + PRECISION_MEDIUMP;
  } while (PVar14 != PRECISION_LAST);
  tcu::TestNode::addChild((TestNode *)local_38,local_70);
  return extraout_EAX;
}

Assistant:

void ShaderAtomicOpTests::init (void)
{
	addChild(createAtomicOpGroup<ShaderAtomicAddCase>		(m_context, m_operandType, "add"));
	addChild(createAtomicOpGroup<ShaderAtomicMinCase>		(m_context, m_operandType, "min"));
	addChild(createAtomicOpGroup<ShaderAtomicMaxCase>		(m_context, m_operandType, "max"));
	addChild(createAtomicOpGroup<ShaderAtomicAndCase>		(m_context, m_operandType, "and"));
	addChild(createAtomicOpGroup<ShaderAtomicOrCase>		(m_context, m_operandType, "or"));
	addChild(createAtomicOpGroup<ShaderAtomicXorCase>		(m_context, m_operandType, "xor"));
	addChild(createAtomicOpGroup<ShaderAtomicExchangeCase>	(m_context, m_operandType, "exchange"));
	addChild(createAtomicOpGroup<ShaderAtomicCompSwapCase>	(m_context, m_operandType, "compswap"));
}